

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cc
# Opt level: O1

size_t flow::computeStackSize(Instruction *program,size_t programSize)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (programSize == 0) {
    uVar4 = 0;
  }
  else {
    lVar2 = 0;
    uVar4 = 0;
    uVar3 = 0;
    do {
      iVar1 = getStackChange(*(Instruction *)((long)program + lVar2));
      uVar3 = uVar3 + (long)iVar1;
      if (uVar4 <= uVar3) {
        uVar4 = uVar3;
      }
      lVar2 = lVar2 + 8;
    } while (programSize << 3 != lVar2);
  }
  return uVar4;
}

Assistant:

size_t computeStackSize(const Instruction* program, size_t programSize) {
  const Instruction* i = program;
  const Instruction* e = program + programSize;
  size_t stackSize = 0;
  size_t limit = 0;

  while (i != e) {
    int change = getStackChange(*i);
    stackSize += change;
    limit = std::max(limit, stackSize);
    i++;
  }

  return limit;
}